

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O0

int __thiscall QHeaderView::logicalIndex(QHeaderView *this,int visualIndex)

{
  bool bVar1;
  int iVar2;
  QHeaderViewPrivate *this_00;
  int in_ESI;
  QHeaderViewPrivate *in_RDI;
  QHeaderViewPrivate *d;
  int local_4;
  
  this_00 = d_func((QHeaderView *)0x835e8b);
  if ((in_ESI < 0) ||
     (local_4 = in_ESI, iVar2 = QHeaderViewPrivate::sectionCount(this_00), iVar2 <= in_ESI)) {
    local_4 = -1;
  }
  else {
    bVar1 = QHeaderViewPrivate::noSectionMemoryUsage(this_00);
    if (!bVar1) {
      local_4 = QHeaderViewPrivate::logicalIndex(in_RDI,local_4);
    }
  }
  return local_4;
}

Assistant:

int QHeaderView::logicalIndex(int visualIndex) const
{
    Q_D(const QHeaderView);
    if (visualIndex < 0 || visualIndex >= d->sectionCount())
        return -1;

    if (d->noSectionMemoryUsage())
        return visualIndex;

    return d->logicalIndex(visualIndex);
}